

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::default_cost_type<float>::make_l2_norm(default_cost_type<float> *this,int n)

{
  float fVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  type pfVar4;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  float div;
  int n_local;
  default_cost_type<float> *this_local;
  
  i_1 = 0;
  for (local_1c = 0; local_1c != n; local_1c = local_1c + 1) {
    pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       (&this->linear_elements,(long)local_1c);
    fVar1 = *pfVar4;
    pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       (&this->linear_elements,(long)local_1c);
    auVar2 = vfmadd213ss_fma(ZEXT416((uint)*pfVar4),ZEXT416((uint)fVar1),ZEXT416((uint)i_1));
    i_1 = auVar2._0_4_;
  }
  bVar3 = std::isnormal((float)i_1);
  if (bVar3) {
    for (local_20 = 0; local_20 != n; local_20 = local_20 + 1) {
      pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                         (&this->linear_elements,(long)local_20);
      *pfVar4 = *pfVar4 / (float)i_1;
    }
  }
  return;
}

Assistant:

void make_l2_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += linear_elements[i] * linear_elements[i];

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }